

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGGeometryElement::updateMarkerPositions
          (SVGGeometryElement *this,SVGMarkerPositionList *positions,SVGLayoutState *state)

{
  bool bVar1;
  PathCommand PVar2;
  int iVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Point origin;
  float angle;
  array<lunasvg::Point,_3UL> points;
  SVGMarkerElement *markerStart;
  SVGMarkerElement *markerMid;
  PathIterator it;
  SVGMarkerElement *markerEnd;
  Point local_c8;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  array<lunasvg::Point,_3UL> local_98;
  SVGMarkerElement *local_78;
  SVGMarkerElement *local_70;
  PathIterator local_68;
  float local_54;
  SVGMarkerElement *local_50;
  float local_48;
  
  bVar1 = Path::isEmpty(&this->m_path);
  if (!bVar1) {
    local_98._M_elems[1] = (Point)(state->m_marker_start)._M_dataplus._M_p;
    local_98._M_elems[0] = (Point)(state->m_marker_start)._M_string_length;
    local_78 = SVGElement::getMarker((SVGElement *)this,(string_view *)&local_98);
    local_98._M_elems[1] = (Point)(state->m_marker_mid)._M_dataplus._M_p;
    local_98._M_elems[0] = (Point)(state->m_marker_mid)._M_string_length;
    local_70 = SVGElement::getMarker((SVGElement *)this,(string_view *)&local_98);
    local_98._M_elems[1] = (Point)(state->m_marker_end)._M_dataplus._M_p;
    local_98._M_elems[0] = (Point)(state->m_marker_end)._M_string_length;
    local_50 = SVGElement::getMarker((SVGElement *)this,(string_view *)&local_98);
    if (((local_50 != (SVGMarkerElement *)0x0) || (local_78 != (SVGMarkerElement *)0x0)) ||
       (local_70 != (SVGMarkerElement *)0x0)) {
      iVar3 = 0;
      local_c8.x = 0.0;
      local_c8.y = 0.0;
      local_98._M_elems[2].x = 0.0;
      local_98._M_elems[2].y = 0.0;
      local_98._M_elems[0].x = 0.0;
      local_98._M_elems[0].y = 0.0;
      local_98._M_elems[1].x = 0.0;
      local_98._M_elems[1].y = 0.0;
      PathIterator::PathIterator(&local_68,&this->m_path);
      if (local_68.m_index < local_68.m_size) {
        local_b0 = 0.0;
        local_b4 = 0.0;
        local_b8 = 0.0;
        local_bc = 0.0;
        local_a0 = 0.0;
        local_9c = 0.0;
        do {
          PVar2 = PathIterator::currentSegment(&local_68,&local_98);
          switch(PVar2) {
          case MoveTo:
            local_b0 = local_c8.x;
            local_b4 = local_c8.y;
            local_c8.x = local_98._M_elems[0].x;
            local_c8.y = local_98._M_elems[0].y;
            local_b8 = local_98._M_elems[0].x;
            local_9c = local_98._M_elems[0].x;
            local_bc = local_98._M_elems[0].y;
            local_a0 = local_98._M_elems[0].y;
            break;
          case LineTo:
            local_b0 = local_c8.x;
            local_b4 = local_c8.y;
            local_bc = local_98._M_elems[0].y;
            local_b8 = local_98._M_elems[0].x;
            local_c8.x = local_98._M_elems[0].x;
            local_c8.y = local_98._M_elems[0].y;
            break;
          case CubicTo:
            local_b0 = local_98._M_elems[1].x;
            local_b4 = local_98._M_elems[1].y;
            local_bc = local_98._M_elems[2].y;
            local_b8 = local_98._M_elems[2].x;
            local_c8.x = local_98._M_elems[2].x;
            local_c8.y = local_98._M_elems[2].y;
            break;
          case Close:
            local_b0 = local_c8.x;
            local_b4 = local_c8.y;
            local_b8 = local_98._M_elems[0].x;
            local_bc = local_98._M_elems[0].y;
            local_c8.x = local_9c;
            local_c8.y = local_a0;
            local_9c = 0.0;
            local_a0 = 0.0;
          }
          PathIterator::next(&local_68);
          if ((local_68.m_index < local_68.m_size) &&
             (local_70 != (SVGMarkerElement *)0x0 || local_78 != (SVGMarkerElement *)0x0)) {
            PathIterator::currentSegment(&local_68,&local_98);
            fVar5 = local_98._M_elems[0].x;
            fVar7 = local_c8.y;
            fVar8 = local_c8.x;
            fVar6 = local_98._M_elems[0].y;
            if ((iVar3 == 0) && (local_78 != (SVGMarkerElement *)0x0)) {
              local_a4 = local_98._M_elems[0].x;
              local_54 = local_c8.x;
              local_a8 = local_98._M_elems[0].y;
              local_48 = local_c8.y;
              fVar5 = atan2f(local_98._M_elems[0].y - local_c8.y,local_98._M_elems[0].x - local_c8.x
                            );
              local_ac = (fVar5 * 180.0) / 3.1415927;
              if ((local_78->m_orient).m_orientType == AutoStartReverse) {
                local_ac = local_ac + -180.0;
              }
              std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
              emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                        ((vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>
                          *)positions,&local_78,&local_c8,&local_ac);
              fVar5 = local_a4;
              fVar7 = local_48;
              fVar8 = local_54;
              fVar6 = local_a8;
            }
            if ((iVar3 != 0) && (local_70 != (SVGMarkerElement *)0x0)) {
              local_a4 = fVar5 - fVar8;
              local_a8 = fVar6 - fVar7;
              fVar5 = atan2f(local_bc - local_b4,local_b8 - local_b0);
              local_48 = (fVar5 * 180.0) / 3.1415927;
              fVar5 = atan2f(local_a8,local_a4);
              fVar5 = (fVar5 * 180.0) / 3.1415927;
              uVar4 = -(uint)(180.0 < ABS(local_48 - fVar5));
              local_ac = ((float)(~uVar4 & (uint)local_48 | (uint)(local_48 + 360.0) & uVar4) +
                         fVar5) * 0.5;
              std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
              emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                        ((vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>
                          *)positions,&local_70,&local_c8,&local_ac);
            }
          }
          if ((local_50 != (SVGMarkerElement *)0x0) && (local_68.m_size <= local_68.m_index)) {
            fVar5 = atan2f(local_bc - local_b4,local_b8 - local_b0);
            local_ac = (fVar5 * 180.0) / 3.1415927;
            std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
            emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                      ((vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>
                        *)positions,&local_50,&local_c8,&local_ac);
          }
          iVar3 = iVar3 + -1;
        } while (local_68.m_index < local_68.m_size);
      }
    }
  }
  return;
}

Assistant:

void SVGGeometryElement::updateMarkerPositions(SVGMarkerPositionList& positions, const SVGLayoutState& state)
{
    if(m_path.isEmpty())
        return;
    auto markerStart = getMarker(state.marker_start());
    auto markerMid = getMarker(state.marker_mid());
    auto markerEnd = getMarker(state.marker_end());
    if(markerStart == nullptr && markerMid == nullptr && markerEnd == nullptr) {
        return;
    }

    Point origin;
    Point startPoint;
    Point inslopePoints[2];
    Point outslopePoints[2];

    int index = 0;
    std::array<Point, 3> points;
    PathIterator it(m_path);
    while(!it.isDone()) {
        switch(it.currentSegment(points)) {
        case PathCommand::MoveTo:
            startPoint = points[0];
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = points[0];
            break;
        case PathCommand::LineTo:
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = points[0];
            break;
        case PathCommand::CubicTo:
            inslopePoints[0] = points[1];
            inslopePoints[1] = points[2];
            origin = points[2];
            break;
        case PathCommand::Close:
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = startPoint;
            startPoint = Point();
            break;
        }

        it.next();

        if(!it.isDone() && (markerStart || markerMid)) {
            it.currentSegment(points);
            outslopePoints[0] = origin;
            outslopePoints[1] = points[0];
            if(index == 0 && markerStart) {
                auto slope = outslopePoints[1] - outslopePoints[0];
                auto angle = 180.f * std::atan2(slope.y, slope.x) / PLUTOVG_PI;
                const auto& orient = markerStart->orient();
                if(orient.orientType() == SVGAngle::OrientType::AutoStartReverse)
                    angle -= 180.f;
                positions.emplace_back(markerStart, origin, angle);
            }

            if(index > 0 && markerMid) {
                auto inslope = inslopePoints[1] - inslopePoints[0];
                auto outslope = outslopePoints[1] - outslopePoints[0];
                auto inangle = 180.f * std::atan2(inslope.y, inslope.x) / PLUTOVG_PI;
                auto outangle = 180.f * std::atan2(outslope.y, outslope.x) / PLUTOVG_PI;
                if(std::abs(inangle - outangle) > 180.f)
                    inangle += 360.f;
                auto angle = (inangle + outangle) * 0.5f;
                positions.emplace_back(markerMid, origin, angle);
            }
        }

        if(markerEnd && it.isDone()) {
            auto slope = inslopePoints[1] - inslopePoints[0];
            auto angle = 180.f * std::atan2(slope.y, slope.x) / PLUTOVG_PI;
            positions.emplace_back(markerEnd, origin, angle);
        }

        index += 1;
    }
}